

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpapi_curl.c
# Opt level: O3

HTTPAPI_RESULT HTTPAPI_Init(void)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  
  if (nUsersOfHTTPAPI == 0) {
    iVar1 = curl_global_init();
    if (iVar1 != 0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 == (LOGGER_LOG)0x0) {
        return HTTPAPI_INIT_FAILED;
      }
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/adapters/httpapi_curl.c"
                ,"HTTPAPI_Init",0x52,1,"(result = %s%s (%d))","",HTTPAPI_RESULTStringStorage[0x10],
                0x10);
      return HTTPAPI_INIT_FAILED;
    }
    nUsersOfHTTPAPI = nUsersOfHTTPAPI + 1;
  }
  else {
    nUsersOfHTTPAPI = nUsersOfHTTPAPI + 1;
  }
  return HTTPAPI_OK;
}

Assistant:

HTTPAPI_RESULT HTTPAPI_Init(void)
{
    HTTPAPI_RESULT result;
    if (nUsersOfHTTPAPI == 0)
    {
        if (curl_global_init(CURL_GLOBAL_NOTHING) != 0)
        {
            result = HTTPAPI_INIT_FAILED;
            LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(HTTPAPI_RESULT, result));
        }
        else
        {
            nUsersOfHTTPAPI++;
            result = HTTPAPI_OK;
        }
    }
    else
    {
        nUsersOfHTTPAPI++;
        result = HTTPAPI_OK;
    }

    return result;
}